

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_compile_identities_derived(lysc_ctx *ctx,lysp_ident *idents_p,lysc_ident **idents)

{
  lysc_ident *plVar1;
  LY_ERR LVar2;
  ulong uVar3;
  char ***pppcVar4;
  ulong uVar5;
  
  uVar5 = 0;
  lysc_update_path(ctx,(lys_module *)0x0,"{identity}");
  do {
    plVar1 = *idents;
    if (plVar1 == (lysc_ident *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)&plVar1[-1].flags;
    }
    if (uVar3 <= uVar5) {
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      return LY_SUCCESS;
    }
    uVar3 = 0;
    pppcVar4 = &idents_p->bases;
    while (idents_p != (lysp_ident *)0x0) {
      if ((*(ulong *)&idents_p[-1].flags <= uVar3) ||
         (((lysp_ident *)(pppcVar4 + -2))->name == plVar1[uVar5].name)) {
        if ((uVar3 != *(ulong *)&idents_p[-1].flags) && (*pppcVar4 != (char **)0x0)) {
          lysc_update_path(ctx,(lys_module *)0x0,plVar1[uVar5].name);
          LVar2 = lys_compile_identity_bases
                            (ctx,ctx->pmod,*pppcVar4,*idents + uVar5,(lysc_ident ***)0x0);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
        }
        break;
      }
      uVar3 = uVar3 + 1;
      pppcVar4 = pppcVar4 + 7;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static LY_ERR
lys_compile_identities_derived(struct lysc_ctx *ctx, struct lysp_ident *idents_p, struct lysc_ident **idents)
{
    LY_ARRAY_COUNT_TYPE u, v;

    lysc_update_path(ctx, NULL, "{identity}");

    for (u = 0; u < LY_ARRAY_COUNT(*idents); ++u) {
        /* find matching parsed identity */
        for (v = 0; v < LY_ARRAY_COUNT(idents_p); ++v) {
            if (idents_p[v].name == (*idents)[u].name) {
                break;
            }
        }

        if ((v == LY_ARRAY_COUNT(idents_p)) || !idents_p[v].bases) {
            /* identity not found (it may be from a submodule) or identity without bases */
            continue;
        }

        lysc_update_path(ctx, NULL, (*idents)[u].name);
        LY_CHECK_RET(lys_compile_identity_bases(ctx, ctx->pmod, idents_p[v].bases, &(*idents)[u], NULL));
        lysc_update_path(ctx, NULL, NULL);
    }

    lysc_update_path(ctx, NULL, NULL);
    return LY_SUCCESS;
}